

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O0

void duckdb_je_fxp_print(fxp_t a,char *buf)

{
  uint32_t uVar1;
  char *in_RSI;
  fxp_t in_EDI;
  int i_1;
  size_t printed;
  int i;
  uint64_t fraction_digits;
  int leading_fraction_zeros;
  uint32_t fractional_part;
  uint32_t integer_part;
  int local_3c;
  size_t local_38;
  int local_2c;
  ulong local_28;
  int local_1c;
  
  uVar1 = fxp_round_down(in_EDI);
  local_1c = 0;
  local_28 = (ulong)(in_EDI & 0xffff);
  for (local_2c = 0; local_2c < 0xe; local_2c = local_2c + 1) {
    if ((local_28 < 0x10000) && (0xffff < local_28 * 10)) {
      local_1c = local_2c;
    }
    local_28 = local_28 * 10;
  }
  for (local_28 = local_28 >> 0x10; local_28 != 0 && local_28 % 10 == 0; local_28 = local_28 / 10) {
  }
  local_38 = duckdb_je_malloc_snprintf(in_RSI,0x15,"%u.",(ulong)uVar1);
  for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
    in_RSI[local_38] = '0';
    local_38 = local_38 + 1;
  }
  duckdb_je_malloc_snprintf(in_RSI + local_38,0x15 - local_38,"%lu",local_28);
  return;
}

Assistant:

void
fxp_print(fxp_t a, char buf[FXP_BUF_SIZE]) {
	uint32_t integer_part = fxp_round_down(a);
	uint32_t fractional_part = (a & ((1U << 16) - 1));

	int leading_fraction_zeros = 0;
	uint64_t fraction_digits = fractional_part;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		if (fraction_digits < (1U << 16)
		    && fraction_digits * 10 >= (1U << 16)) {
			leading_fraction_zeros = i;
		}
		fraction_digits *= 10;
	}
	fraction_digits >>= 16;
	while (fraction_digits > 0 && fraction_digits % 10 == 0) {
		fraction_digits /= 10;
	}

	size_t printed = malloc_snprintf(buf, FXP_BUF_SIZE, "%"FMTu32".",
	    integer_part);
	for (int i = 0; i < leading_fraction_zeros; i++) {
		buf[printed] = '0';
		printed++;
	}
	malloc_snprintf(&buf[printed], FXP_BUF_SIZE - printed, "%"FMTu64,
	    fraction_digits);
}